

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O3

void __thiscall QMainWindow::contextMenuEvent(QMainWindow *this,QContextMenuEvent *event)

{
  long lVar1;
  QWidgetData *pQVar2;
  char cVar3;
  bool bVar4;
  QWidget *pQVar5;
  long lVar6;
  QDockWidget *this_00;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  event[0xc] = (QContextMenuEvent)0x0;
  pQVar5 = QWidget::childAt(&this->super_QWidget,(QPoint *)(event + 0x28));
  if (pQVar5 == &this->super_QWidget || pQVar5 == (QWidget *)0x0) {
LAB_0042a7da:
    if (pQVar5 != &this->super_QWidget) {
LAB_0042a7df:
      pQVar5 = (QWidget *)(**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (pQVar5 != (QWidget *)0x0) {
        bVar4 = QMenu::isEmpty((QMenu *)pQVar5);
        if (bVar4) {
          (**(code **)(*(long *)pQVar5 + 0x20))(pQVar5);
        }
        else {
          QWidget::setAttribute(pQVar5,WA_DeleteOnClose,true);
          QMenu::popup((QMenu *)pQVar5,(QPoint *)(event + 0x30),(QAction *)0x0);
          event[0xc] = (QContextMenuEvent)0x1;
        }
      }
    }
LAB_0042a834:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return;
  }
  do {
    lVar6 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar6 != 0) {
LAB_0042a767:
      if ((pQVar5 == &this->super_QWidget) ||
         (*(QMainWindow **)(*(long *)(lVar6 + 8) + 0x10) != this)) goto LAB_0042a834;
      goto LAB_0042a7df;
    }
    this_00 = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (this_00 != (QDockWidget *)0x0) {
      if (*(QMainWindow **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x10) != this)
      goto LAB_0042a834;
      pQVar7 = QDockWidget::widget(this_00);
      if (pQVar7 != (QWidget *)0x0) {
        pQVar7 = QDockWidget::widget(this_00);
        pQVar2 = pQVar7->data;
        QWidget::mapFrom(pQVar5,&this->super_QWidget,(QPoint *)(event + 0x28));
        cVar3 = QRect::contains((QPoint *)&pQVar2->crect,true);
        if ((pQVar5 == &this->super_QWidget) || (cVar3 != '\0')) goto LAB_0042a834;
        goto LAB_0042a7df;
      }
      goto LAB_0042a7da;
    }
    lVar6 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
    if (lVar6 != 0) goto LAB_0042a767;
    pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10);
    if ((pQVar5 == (QWidget *)0x0) || (pQVar5 == &this->super_QWidget)) goto LAB_0042a7da;
  } while( true );
}

Assistant:

void QMainWindow::contextMenuEvent(QContextMenuEvent *event)
{
    event->ignore();
    // only show the context menu for direct QDockWidget and QToolBar
    // children and for the menu bar as well
    QWidget *child = childAt(event->pos());
    while (child && child != this) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar *>(child)) {
            if (mb->parentWidget() != this)
                return;
            break;
        }
#endif
#if QT_CONFIG(dockwidget)
        if (QDockWidget *dw = qobject_cast<QDockWidget *>(child)) {
            if (dw->parentWidget() != this)
                return;
            if (dw->widget()
                && dw->widget()->geometry().contains(child->mapFrom(this, event->pos()))) {
                // ignore the event if the mouse is over the QDockWidget contents
                return;
            }
            break;
        }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar *>(child)) {
            if (tb->parentWidget() != this)
                return;
            break;
        }
#endif
        child = child->parentWidget();
    }
    if (child == this)
        return;

#if QT_CONFIG(menu)
    QMenu *popup = createPopupMenu();
    if (popup) {
        if (!popup->isEmpty()) {
            popup->setAttribute(Qt::WA_DeleteOnClose);
            popup->popup(event->globalPos());
            event->accept();
        } else {
            delete popup;
        }
    }
#endif
}